

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.c
# Opt level: O0

bool_t memTest(void)

{
  bool_t bVar1;
  int iVar2;
  void *pvVar3;
  char *hex;
  size_t sVar4;
  size_t i;
  void *p1;
  void *p;
  octet buf2 [16];
  octet buf1 [16];
  octet buf [16];
  undefined7 in_stack_ffffffffffffffa8;
  octet in_stack_ffffffffffffffaf;
  void *in_stack_ffffffffffffffb0;
  void *pvVar5;
  void *in_stack_ffffffffffffffc8;
  char in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  char local_28 [16];
  char local_18 [24];
  
  memSet(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf,0x104965);
  bVar1 = memIsValid(local_18,0x10);
  if ((bVar1 == 0) || (bVar1 = memIsValid((void *)0x0,0), bVar1 == 0)) {
    return 0;
  }
  pvVar3 = memAlloc(0x1049a1);
  if (pvVar3 == (void *)0x0) {
    return 0;
  }
  memSet(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf,0x1049cf);
  pvVar3 = memRealloc((void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0x1049de
                     );
  if ((((pvVar3 == (void *)0x0) || (bVar1 = memIsRep(pvVar3,100,'\a'), bVar1 == 0)) ||
      (hex = (char *)memRealloc((void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8
                                                ),0x104a16), hex == (char *)0x0)) ||
     ((bVar1 = memIsRep(hex,0x5a,'\a'), bVar1 == 0 ||
      (pvVar3 = memRealloc((void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                           0x104a4d), pvVar3 != (void *)0x0)))) {
    memFree((void *)0x104a62);
    return 0;
  }
  memFree((void *)0x104a79);
  memSet(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf,0x104a8d);
  memCopy(in_stack_ffffffffffffffb0,
          (void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0x104aa1);
  for (pvVar5 = (void *)0x0; pvVar5 < (void *)0x10; pvVar5 = (void *)((long)pvVar5 + 1)) {
    if (local_28[(long)pvVar5] != local_18[(long)pvVar5]) {
      return 0;
    }
    local_28[(long)pvVar5] = (char)pvVar5;
    local_18[(long)pvVar5] = (char)pvVar5;
  }
  memMove(pvVar5,(void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0x104b1e);
  memMove(pvVar5,(void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0x104b36);
  for (pvVar5 = (void *)0x0; pvVar5 < (void *)0xe; pvVar5 = (void *)((long)pvVar5 + 1)) {
    if ((local_28 + 2)[(long)pvVar5] != local_18[(long)pvVar5]) {
      return 0;
    }
  }
  memCopy(pvVar5,(void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0x104b8f);
  memMove(pvVar5,(void *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0x104ba0);
  hexTo(pvVar5,(char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  hexTo(pvVar5,(char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  bVar1 = memIsZero(local_18,0xf);
  if (((((((bVar1 != 0) || (bVar1 = memIsZero_fast(local_18,0xf), bVar1 != 0)) ||
         ((bVar1 = memIsZero_fast(local_18,3), bVar1 != 0 ||
          (((bVar1 = memEq(local_18 + 1,local_28 + 1,0xf), bVar1 != 0 ||
            (bVar1 = memEq_fast(pvVar5,(void *)CONCAT17(in_stack_ffffffffffffffaf,
                                                        in_stack_ffffffffffffffa8),0x104c4b),
            bVar1 != 0)) || (bVar1 = memEq(local_18 + 8,local_28 + 8,8), bVar1 != 0)))))) ||
        ((bVar1 = memEq_fast(pvVar5,(void *)CONCAT17(in_stack_ffffffffffffffaf,
                                                     in_stack_ffffffffffffffa8),0x104c95),
         bVar1 != 0 || (bVar1 = memEq(local_18 + 1,local_28 + 1,8), bVar1 == 0)))) ||
       ((bVar1 = memEq_fast(pvVar5,(void *)CONCAT17(in_stack_ffffffffffffffaf,
                                                    in_stack_ffffffffffffffa8),0x104cdf), bVar1 == 0
        || (((bVar1 = memEq(local_18 + 1,local_28 + 1,0xe), bVar1 == 0 ||
             (bVar1 = memEq_fast(pvVar5,(void *)CONCAT17(in_stack_ffffffffffffffaf,
                                                         in_stack_ffffffffffffffa8),0x104d29),
             bVar1 == 0)) ||
            ((iVar2 = memCmp(local_18,local_28,7), iVar2 != -1 ||
             (((iVar2 = memCmp_fast(local_18,local_28,7), iVar2 != -1 ||
               (iVar2 = memCmpRev(local_18,local_28,7), iVar2 != -1)) ||
              (iVar2 = memCmpRev_fast(local_18,local_28,7), iVar2 != -1)))))))))) ||
      (((iVar2 = memCmp(local_18,local_28,0xf), iVar2 != -1 ||
        (iVar2 = memCmp_fast(local_18,local_28,0xf), iVar2 != -1)) ||
       (iVar2 = memCmpRev(local_18,local_28,0xf), iVar2 != -1)))) ||
     (((((iVar2 = memCmpRev_fast(local_18,local_28,0xf), iVar2 != -1 ||
         (iVar2 = memCmp(local_28,local_18,0xf), iVar2 != 1)) ||
        ((iVar2 = memCmp_fast(local_28,local_18,0xf), iVar2 != 1 ||
         ((((iVar2 = memCmpRev(local_28,local_18,0xf), iVar2 != 1 ||
            (iVar2 = memCmpRev_fast(local_28,local_18,0xf), iVar2 != 1)) ||
           (iVar2 = memCmp(local_18,local_28,8), iVar2 != -1)) ||
          ((iVar2 = memCmp_fast(local_18,local_28,8), iVar2 != -1 ||
           (iVar2 = memCmpRev(local_18,local_28,8), iVar2 != -1)))))))) ||
       ((iVar2 = memCmpRev_fast(local_18,local_28,8), iVar2 != -1 ||
        ((iVar2 = memCmp(local_28,local_18,8), iVar2 != 1 ||
         (iVar2 = memCmp_fast(local_28,local_18,8), iVar2 != 1)))))) ||
      ((((iVar2 = memCmpRev(local_28,local_18,8), iVar2 != 1 ||
         (((iVar2 = memCmpRev_fast(local_28,local_18,8), iVar2 != 1 ||
           (iVar2 = memCmp(local_18 + 1,local_28 + 1,8), iVar2 != 0)) ||
          (iVar2 = memCmp_fast(local_18 + 1,local_28 + 1,8), iVar2 != 0)))) ||
        (((iVar2 = memCmp(local_18 + 1,local_28 + 1,0xe), iVar2 != 0 ||
          (iVar2 = memCmp_fast(local_18 + 1,local_28 + 1,0xe), iVar2 != 0)) ||
         (iVar2 = memCmpRev(local_18 + 1,local_28 + 1,8), iVar2 != 0)))) ||
       (((iVar2 = memCmpRev_fast(local_18 + 1,local_28 + 1,8), iVar2 != 0 ||
         (iVar2 = memCmpRev(local_18 + 1,local_28 + 1,0xe), iVar2 != 0)) ||
        (iVar2 = memCmpRev_fast(local_18 + 1,local_28 + 1,0xe), iVar2 != 0)))))))) {
    return 0;
  }
  memRev(local_18,0xf);
  sVar4 = memNonZeroSize(local_18,0xf);
  if (sVar4 != 0xe) {
    return 0;
  }
  hexTo(pvVar5,(char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  hexTo(pvVar5,(char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  iVar2 = memCmp(local_18,local_28,8);
  if (((((iVar2 != 1) || (iVar2 = memCmp_fast(local_18,local_28,8), iVar2 != 1)) ||
       (iVar2 = memCmp(local_28,local_18,8), iVar2 != -1)) ||
      ((iVar2 = memCmp_fast(local_28,local_18,8), iVar2 != -1 ||
       (iVar2 = memCmpRev(local_18,local_28,8), iVar2 != -1)))) ||
     ((iVar2 = memCmpRev_fast(local_18,local_28,8), iVar2 != -1 ||
      ((iVar2 = memCmpRev(local_28,local_18,8), iVar2 != 1 ||
       (iVar2 = memCmpRev_fast(local_28,local_18,8), iVar2 != 1)))))) {
    return 0;
  }
  hexTo(pvVar5,(char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  bVar1 = memIsRep(local_18,7,'\x01');
  if (((bVar1 != 1) ||
      (((((bVar1 = memIsRep_fast(local_18,7,'\x01'), bVar1 != 1 ||
          (bVar1 = memIsRep(local_18,8,'\x01'), bVar1 != 1)) ||
         (bVar1 = memIsRep_fast(local_18,8,'\x01'), bVar1 != 1)) ||
        ((bVar1 = memIsRep(local_18,9,'\x01'), bVar1 != 1 ||
         (bVar1 = memIsRep_fast(local_18,9,'\x01'), bVar1 != 1)))) ||
       (bVar1 = memIsRep(local_18,10,'\x01'), bVar1 == 1)))) ||
     (bVar1 = memIsRep_fast(local_18,10,'\x01'), bVar1 == 1)) {
    return 0;
  }
  hexTo(pvVar5,(char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  memJoin((void *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
          in_stack_ffffffffffffffc8,(size_t)pvVar3,hex,(size_t)pvVar5);
  bVar1 = hexEq(pvVar3,hex);
  if (bVar1 == 0) {
    return 0;
  }
  hexTo(pvVar5,(char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  memJoin((void *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
          in_stack_ffffffffffffffc8,(size_t)pvVar3,hex,(size_t)pvVar5);
  bVar1 = hexEq(pvVar3,hex);
  if (bVar1 == 0) {
    return 0;
  }
  hexTo(pvVar5,(char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  memJoin((void *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
          in_stack_ffffffffffffffc8,(size_t)pvVar3,hex,(size_t)pvVar5);
  bVar1 = hexEq(pvVar3,hex);
  if (bVar1 == 0) {
    return 0;
  }
  hexTo(pvVar5,(char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  memJoin((void *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
          in_stack_ffffffffffffffc8,(size_t)pvVar3,hex,(size_t)pvVar5);
  bVar1 = hexEq(pvVar3,hex);
  if (bVar1 == 0) {
    return 0;
  }
  hexTo(pvVar5,(char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  hexTo(pvVar5,(char *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  memXor(&stack0xffffffffffffffc8,local_18,local_28,9);
  bVar1 = memIsRep(&stack0xffffffffffffffc8,9,0xf0);
  if (bVar1 == 0) {
    return 0;
  }
  memXor2(&stack0xffffffffffffffc8,local_28,9);
  memXor2(&stack0xffffffffffffffc8,local_18,8);
  bVar1 = memIsRep(&stack0xffffffffffffffc8,8,'\0');
  if ((bVar1 != 0) && (in_stack_ffffffffffffffd0 == '\b')) {
    return 1;
  }
  return 0;
}

Assistant:

bool_t memTest()
{
	octet buf[16];
	octet buf1[16];
	octet buf2[16];
	void* p;
	void* p1;
	size_t i;
	// pre
	CASSERT(sizeof(buf) == sizeof(buf1));
	memSetZero(buf, sizeof(buf));
	if (!memIsValid(buf, sizeof(buf)) || !memIsValid(0, 0))
		return FALSE;
	// alloc (считаем, что памяти хватает)
	p = memAlloc(100);
	if (!p)
		return FALSE;
	memSet(p, 7, 100);
	if (!(p1 = memRealloc(p, 102)) || 
		!memIsRep(p = p1, 100, 7) ||
		!(p1 = memRealloc(p, 90)) || 
		!memIsRep(p = p1, 90, 7) ||
		(p = memRealloc(p, 0)))
	{
		memFree(p);
		return FALSE;
	}
	memFree(p);
	// заполнение / копирование
	memSet(buf, 12, sizeof(buf));
	memCopy(buf1, buf, sizeof(buf));
	for (i = 0; i < sizeof(buf); ++i)
	{
		if (buf1[i] != buf[i])
			return FALSE;
		buf[i] = buf1[i] = i % 256u;
	}
	memMove(buf, buf + 1, sizeof(buf) - 1);
	memMove(buf1 + 1, buf1, sizeof(buf1) - 1);
	for (i = 0; i < sizeof(buf) - 2; ++i)
	{
		if (buf1[i + 2] != buf[i])
			return FALSE;
	}
	memCopy(buf1, 0, 0);
	memMove(buf1, 0, 0);
	// сравнение
	hexTo(buf,  "000102030405060708090A0B0C0D0E0F");
	hexTo(buf1, "F00102030405060708090A0B0C0D0EFF");
	if (SAFE(memIsZero)(buf, 15) ||
		FAST(memIsZero)(buf, 15) ||
		FAST(memIsZero)(buf, 3) ||
		SAFE(memEq)(buf + 1, buf1 + 1, 15) ||
		FAST(memEq)(buf + 1, buf1 + 1, 15) ||
		SAFE(memEq)(buf + 8, buf1 + 8, 8) ||
		FAST(memEq)(buf + 8, buf1 + 8, 8) ||
		!SAFE(memEq)(buf + 1, buf1 + 1, 8) ||
		!FAST(memEq)(buf + 1, buf1 + 1, 8) ||
		!SAFE(memEq)(buf + 1, buf1 + 1, 14) ||
		!FAST(memEq)(buf + 1, buf1 + 1, 14) ||
		SAFE(memCmp)(buf, buf1, 7) != -1 ||
		FAST(memCmp)(buf, buf1, 7) != -1 ||
		SAFE(memCmpRev)(buf, buf1, 7) != -1 ||
		FAST(memCmpRev)(buf, buf1, 7) != -1 ||
		SAFE(memCmp)(buf, buf1, 15) != -1 ||
		FAST(memCmp)(buf, buf1, 15) != -1 ||
		SAFE(memCmpRev)(buf, buf1, 15) != -1 ||
		FAST(memCmpRev)(buf, buf1, 15) != -1 ||
		SAFE(memCmp)(buf1, buf, 15) != 1 ||
		FAST(memCmp)(buf1, buf, 15) != 1 ||
		SAFE(memCmpRev)(buf1, buf, 15) != 1 ||
		FAST(memCmpRev)(buf1, buf, 15) != 1 ||
		SAFE(memCmp)(buf, buf1, 8) != -1 ||
		FAST(memCmp)(buf, buf1, 8) != -1 ||
		SAFE(memCmpRev)(buf, buf1, 8) != -1 ||
		FAST(memCmpRev)(buf, buf1, 8) != -1 ||
		SAFE(memCmp)(buf1, buf, 8) != 1 ||
		FAST(memCmp)(buf1, buf, 8) != 1 ||
		SAFE(memCmpRev)(buf1, buf, 8) != 1 ||
		FAST(memCmpRev)(buf1, buf, 8) != 1 ||
		SAFE(memCmp)(buf + 1, buf1 + 1, 8) != 0 ||
		FAST(memCmp)(buf + 1, buf1 + 1, 8) != 0 ||
		SAFE(memCmp)(buf + 1, buf1 + 1, 14) != 0 ||
		FAST(memCmp)(buf + 1, buf1 + 1, 14) != 0 ||
		SAFE(memCmpRev)(buf + 1, buf1 + 1, 8) != 0 ||
		FAST(memCmpRev)(buf + 1, buf1 + 1, 8) != 0 ||
		SAFE(memCmpRev)(buf + 1, buf1 + 1, 14) != 0 ||
		FAST(memCmpRev)(buf + 1, buf1 + 1, 14) != 0)
		return FALSE;
	memRev(buf, 15);
	if (memNonZeroSize(buf, 15) != 14)
		return FALSE;
	hexTo(buf,  "F001020304050607");
	hexTo(buf1, "00010203040506F7");
	if (SAFE(memCmp)(buf, buf1, 8) != 1 ||
		FAST(memCmp)(buf, buf1, 8) != 1 ||
		SAFE(memCmp)(buf1, buf, 8) != -1 ||
		FAST(memCmp)(buf1, buf, 8) != -1 ||
		SAFE(memCmpRev)(buf, buf1, 8) != -1 ||
		FAST(memCmpRev)(buf, buf1, 8) != -1 ||
		SAFE(memCmpRev)(buf1, buf, 8) != 1 ||
		FAST(memCmpRev)(buf1, buf, 8) != 1)
		return FALSE;
	hexTo(buf, "01010101010101010102");
	if (SAFE(memIsRep)(buf, 7, 0x01) != TRUE ||
		FAST(memIsRep)(buf, 7, 0x01) != TRUE ||
		SAFE(memIsRep)(buf, 8, 0x01) != TRUE ||
		FAST(memIsRep)(buf, 8, 0x01) != TRUE ||
		SAFE(memIsRep)(buf, 9, 0x01) != TRUE ||
		FAST(memIsRep)(buf, 9, 0x01) != TRUE ||
		SAFE(memIsRep)(buf, 10, 0x01) == TRUE ||
		FAST(memIsRep)(buf, 10, 0x01) == TRUE)
		return FALSE;
	// join
	hexTo(buf, "0001020304050607");
	memJoin(buf, buf + 1, 3, buf + 3, 4);
	if (!hexEq(buf, "01020303040506"))
		return FALSE;
	hexTo(buf, "0001020304050607");
	memJoin(buf, buf + 1, 3, buf + 1, 4);
	if (!hexEq(buf, "01020301020304"))
		return FALSE;
	hexTo(buf, "0001020304050607");
	memJoin(buf, buf + 3, 4, buf + 2, 2);
	if (!hexEq(buf, "030405060203"))
		return FALSE;
	hexTo(buf, "0001020304050607");
	memJoin(buf + 2, buf, 4, buf + 4, 2);
	if (!hexEq(buf + 2, "000102030405"))
		return FALSE;
	// xor
	hexTo(buf, "000102030405060708");
	hexTo(buf1, "F0F1F2F3F4F5F6F7F8");
	memXor(buf2, buf, buf1, 9);
	if (!memIsRep(buf2, 9, 0xF0))
		return FALSE;
	memXor2(buf2, buf1, 9);
	memXor2(buf2, buf, 8);
	if (!memIsRep(buf2, 8, 0) || buf2[8] != 0x08)
		return FALSE;
	// все нормально
	return TRUE;
}